

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

bool QFileSystemEngine::renameFile
               (QFileSystemEntry *source,QFileSystemEntry *target,QSystemError *error)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint *puVar4;
  ulong uVar5;
  int *piVar6;
  bool bVar7;
  char *b;
  char *pcVar8;
  char *b_1;
  char *pcVar9;
  long in_FS_OFFSET;
  NativePath local_68;
  NativePath local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_48,source);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_68,target);
  pcVar8 = local_48.d.ptr;
  if (((((undefined1 *)local_48.d.size == (undefined1 *)0x0) ||
       (pvVar3 = memchr(local_48.d.ptr,0,local_48.d.size), pcVar9 = local_68.d.ptr,
       (long)pvVar3 - (long)pcVar8 != -1 && pvVar3 != (void *)0x0)) ||
      ((undefined1 *)local_68.d.size == (undefined1 *)0x0)) ||
     (pvVar3 = memchr(local_68.d.ptr,0,local_68.d.size),
     (long)pvVar3 - (long)pcVar9 != -1 && pvVar3 != (void *)0x0)) {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
  }
  else {
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "";
    }
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    iVar2 = renameat2(0xffffff9c,pcVar8,0xffffff9c,pcVar9,1);
    bVar7 = true;
    if (iVar2 == 0) goto LAB_00170754;
    puVar4 = (uint *)__errno_location();
    uVar5 = (ulong)*puVar4;
    if (uVar5 == 0x16) {
      pcVar8 = local_48.d.ptr;
      if (local_48.d.ptr == (char *)0x0) {
        pcVar8 = "";
      }
      pcVar9 = local_68.d.ptr;
      if (local_68.d.ptr == (char *)0x0) {
        pcVar9 = "";
      }
      iVar2 = link(pcVar8,pcVar9);
      if (iVar2 == 0) {
        pcVar8 = local_48.d.ptr;
        if (local_48.d.ptr == (char *)0x0) {
          pcVar8 = "";
        }
        iVar2 = unlink(pcVar8);
        if (iVar2 == 0) goto LAB_00170754;
        uVar1 = *puVar4;
        pcVar8 = local_68.d.ptr;
        if (local_68.d.ptr == (char *)0x0) {
          pcVar8 = "";
        }
        unlink(pcVar8);
        *error = (QSystemError)((ulong)uVar1 | 0x100000000);
        goto LAB_00170752;
      }
      uVar5 = (ulong)*puVar4;
      if ((0x24 < uVar5) || ((0x1040162004U >> (uVar5 & 0x3f) & 1) == 0)) {
        pcVar8 = local_48.d.ptr;
        if (local_48.d.ptr == (char *)0x0) {
          pcVar8 = "";
        }
        pcVar9 = local_68.d.ptr;
        if (local_68.d.ptr == (char *)0x0) {
          pcVar9 = "";
        }
        iVar2 = rename(pcVar8,pcVar9);
        if (iVar2 == 0) goto LAB_00170754;
        uVar5 = (ulong)*puVar4;
      }
    }
    *error = (QSystemError)(uVar5 | 0x100000000);
  }
LAB_00170752:
  bVar7 = false;
LAB_00170754:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QFileSystemEngine::renameFile(const QFileSystemEntry &source, const QFileSystemEntry &target, QSystemError &error)
{
    QFileSystemEntry::NativePath srcPath = source.nativeFilePath();
    QFileSystemEntry::NativePath tgtPath = target.nativeFilePath();

    Q_CHECK_FILE_NAME(srcPath, false);
    Q_CHECK_FILE_NAME(tgtPath, false);

#if defined(RENAME_NOREPLACE) && QT_CONFIG(renameat2)
    if (renameat2(AT_FDCWD, srcPath, AT_FDCWD, tgtPath, RENAME_NOREPLACE) == 0)
        return true;

    // We can also get EINVAL for some non-local filesystems.
    if (errno != EINVAL) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }
#endif
#if defined(Q_OS_DARWIN) && defined(RENAME_EXCL)
    if (renameatx_np(AT_FDCWD, srcPath, AT_FDCWD, tgtPath, RENAME_EXCL) == 0)
        return true;
    if (errno != ENOTSUP) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }
#endif

    if (SupportsHardlinking && ::link(srcPath, tgtPath) == 0) {
        if (::unlink(srcPath) == 0)
            return true;

        // if we managed to link but can't unlink the source, it's likely
        // it's in a directory we don't have write access to; fail the
        // renaming instead
        int savedErrno = errno;

        // this could fail too, but there's nothing we can do about it now
        ::unlink(tgtPath);

        error = QSystemError(savedErrno, QSystemError::StandardLibraryError);
        return false;
    } else if (!SupportsHardlinking) {
        // man 2 link on Linux has:
        // EPERM  The filesystem containing oldpath and newpath does not
        //        support the creation of hard links.
        errno = EPERM;
    }

    switch (errno) {
    case EACCES:
    case EEXIST:
    case ENAMETOOLONG:
    case ENOENT:
    case ENOTDIR:
    case EROFS:
    case EXDEV:
        // accept the error from link(2) (especially EEXIST) and don't retry
        break;

    default:
        // fall back to rename()
        // ### Race condition. If a file is moved in after this, it /will/ be
        // overwritten.
        if (::rename(srcPath, tgtPath) == 0)
            return true;
    }

    error = QSystemError(errno, QSystemError::StandardLibraryError);
    return false;
}